

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_func_call_arg_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg,uint32_t id)

{
  MSLFormatResolution MVar1;
  Variant *pVVar2;
  SPIRFunction *pSVar3;
  size_t sVar4;
  bool bVar5;
  SPIRType *type;
  SPIRType *pSVar6;
  ulong uVar7;
  SPIRConstant *pSVar8;
  TypedID<(spirv_cross::Types)0> *pTVar9;
  SPIRVariable *pSVar10;
  MSLConstexprSampler *pMVar11;
  long *plVar12;
  size_type sVar13;
  undefined8 *puVar14;
  runtime_error *prVar15;
  size_type *psVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  uint32_t uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  uint *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_stack_ffffffffffffed18;
  uint32_t id_local;
  byte local_12ce;
  byte local_12cd;
  uint32_t var_id;
  CompilerMSL *local_12c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c0;
  Parameter *local_12a0;
  MSLConstexprSampler *local_1298;
  SPIRType *local_1290;
  string local_1288;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  samp_args;
  string local_1148;
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t sStack_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  paVar17 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar17;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  id_local = id;
  type = Compiler::expression_type((Compiler *)this,id);
  local_12a0 = arg;
  local_12cd = Compiler::has_extended_decoration
                         ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler);
  bVar5 = Compiler::has_extended_decoration
                    ((Compiler *)this,id_local,SPIRVCrossDecorationDynamicImageSampler);
  local_12ce = local_12cd ^ 1;
  if (!bVar5 && local_12ce == 0) {
    pSVar6 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (type->image).type.id);
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
    (**(code **)((long)&in_R8[4].field_2 + 8))(&samp_args,this,pSVar6,0);
    join<char_const(&)[24],std::__cxx11::string,char_const(&)[3]>
              ((string *)local_1128,(spirv_cross *)"spvDynamicImageSampler<",
               (char (*) [24])&samp_args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f4c88,
               (char (*) [3])in_R8);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1128);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    if (samp_args.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &samp_args.buffer_capacity) {
      operator_delete(samp_args.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr);
    }
  }
  uVar7 = (ulong)id_local;
  if ((uVar7 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar7].type == TypeConstant)) {
    pSVar8 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + uVar7);
  }
  else {
    pSVar8 = (SPIRConstant *)0x0;
  }
  if (((pSVar8 == (SPIRConstant *)0x0) || ((this->msl_options).force_native_arrays == false)) ||
     (pSVar6 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar8->super_IVariant).field_0xc),
     (pSVar6->array).super_VectorView<unsigned_int>.buffer_size == 0)) {
    CompilerGLSL::to_func_call_arg_abi_cxx11_
              ((string *)local_1128,&this->super_CompilerGLSL,local_12a0,id_local);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  else {
    join<char_const(&)[2],unsigned_int&,char_const(&)[12]>
              ((string *)local_1128,(spirv_cross *)0x2e7de5,(char (*) [2])&id_local,
               (uint *)"_array_copy",(char (*) [12])in_R8);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1128);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    pSVar3 = (this->super_CompilerGLSL).super_Compiler.current_function;
    pTVar9 = (pSVar3->constant_arrays_needed_on_stack).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_1128._0_4_ = id_local;
    pTVar9 = ::std::
             __find_if<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)0>const>>
                       (pTVar9,pTVar9 + (pSVar3->constant_arrays_needed_on_stack).
                                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                        .buffer_size);
    if (pTVar9 == (pSVar3->constant_arrays_needed_on_stack).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr +
                  (pSVar3->constant_arrays_needed_on_stack).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size) {
      Compiler::force_recompile((Compiler *)this);
      uVar18 = id_local;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::reserve
                (&pSVar3->constant_arrays_needed_on_stack,
                 (pSVar3->constant_arrays_needed_on_stack).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size + 1);
      sVar4 = (pSVar3->constant_arrays_needed_on_stack).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
      (pSVar3->constant_arrays_needed_on_stack).
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr[sVar4].id = uVar18;
      (pSVar3->constant_arrays_needed_on_stack).
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = sVar4 + 1;
      in_stack_ffffffffffffed18 = paVar17;
    }
  }
  var_id = 0;
  uVar7 = (ulong)id_local;
  if ((uVar7 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar2[uVar7].type == TypeVariable)) {
    pSVar10 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar7);
  }
  else {
    pSVar10 = (SPIRVariable *)0x0;
  }
  if (pSVar10 != (SPIRVariable *)0x0) {
    var_id = (pSVar10->basevariable).id;
  }
  if (bVar5) goto LAB_00275256;
  uVar18 = var_id;
  if (var_id == 0) {
    uVar18 = id_local;
  }
  pMVar11 = find_constexpr_sampler(this,uVar18);
  if (*(int *)&(type->super_IVariant).field_0xc == 0x11) {
    uVar18 = 1;
    in_stack_ffffffffffffed18 = paVar17;
    local_1290 = type;
    if (((pMVar11 != (MSLConstexprSampler *)0x0) && (pMVar11->ycbcr_conversion_enable == true)) &&
       (uVar18 = pMVar11->planes, local_12a0->alias_global_variable == false)) {
      add_spv_func_and_recompile(this,SPVFuncImplDynamicImageSampler);
      in_stack_ffffffffffffed18 = paVar17;
    }
    local_12c0._M_dataplus._M_p._0_4_ = 1;
    local_12c8 = this;
    local_1298 = pMVar11;
    if (1 < uVar18) {
      do {
        CompilerGLSL::to_func_call_arg_abi_cxx11_
                  ((string *)&samp_args,&local_12c8->super_CompilerGLSL,local_12a0,id_local);
        in_R8 = &local_12c0;
        join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                  ((string *)local_1128,(spirv_cross *)0x2f4768,(char (*) [3])&samp_args,
                   &this->plane_name_suffix,&local_12c0,in_R9);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1128._0_8_);
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
        if (samp_args.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &samp_args.buffer_capacity) {
          operator_delete(samp_args.
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .ptr);
        }
        local_12c0._M_dataplus._M_p._0_4_ = (uint)local_12c0._M_dataplus._M_p + 1;
      } while ((uint)local_12c0._M_dataplus._M_p < uVar18);
    }
    type = local_1290;
    pMVar11 = local_1298;
    this = local_12c8;
    if ((local_1290->image).dim != DimBuffer) {
      uVar18 = var_id;
      if (var_id == 0) {
        uVar18 = id_local;
      }
      to_sampler_expression_abi_cxx11_((string *)&samp_args,local_12c8,uVar18);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      plVar12 = (long *)::std::__cxx11::string::replace((ulong)&samp_args,0,(char *)0x0,0x2f4768);
      psVar16 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar16) {
        local_1128._16_8_ = *psVar16;
        local_1128._24_8_ = plVar12[3];
        local_1128._0_8_ = local_1128 + 0x10;
      }
      else {
        local_1128._16_8_ = *psVar16;
        local_1128._0_8_ = (size_type *)*plVar12;
      }
      local_1128._8_8_ = plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1128._0_8_);
      if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      if (samp_args.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &samp_args.buffer_capacity) {
        operator_delete(samp_args.
                        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .ptr);
      }
    }
    if ((pMVar11 != (MSLConstexprSampler *)0x0 && local_12ce == 0) &&
       (pMVar11->ycbcr_conversion_enable == true)) {
      samp_args.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &samp_args.stack_storage;
      samp_args.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size = 0;
      samp_args.buffer_capacity = 8;
      MVar1 = pMVar11->resolution;
      if (MVar1 != MSL_FORMAT_RESOLUTION_444) {
        if (MVar1 == MSL_FORMAT_RESOLUTION_420) {
          local_1128._0_8_ = local_1128 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"spvFormatResolution::_420","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&samp_args,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1128);
          if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) goto LAB_00274afd;
        }
        else {
          if (MVar1 != MSL_FORMAT_RESOLUTION_422) {
            prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1128._0_8_ = local_1128 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1128,"Invalid format resolution.","");
            ::std::runtime_error::runtime_error(prVar15,(string *)local_1128);
            *(undefined ***)prVar15 = &PTR__runtime_error_0035b0b8;
            __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_1128._0_8_ = local_1128 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"spvFormatResolution::_422","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&samp_args,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1128);
          if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
LAB_00274afd:
            operator_delete((void *)local_1128._0_8_);
          }
        }
      }
      if (pMVar11->chroma_filter != MSL_SAMPLER_FILTER_NEAREST) {
        local_1128._0_8_ = local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"spvChromaFilter::linear","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&samp_args,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      if (pMVar11->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
        local_1128._0_8_ = local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"spvXChromaLocation::midpoint","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&samp_args,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      if (pMVar11->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
        local_1128._0_8_ = local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"spvYChromaLocation::midpoint","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&samp_args,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      switch(pMVar11->ycbcr_model) {
      case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
        break;
      case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
        local_1128._0_8_ = local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"spvYCbCrModelConversion::ycbcr_identity","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&samp_args,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
LAB_00274d4d:
          operator_delete((void *)local_1128._0_8_);
        }
        break;
      case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
        local_1128._0_8_ = local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"spvYCbCrModelConversion::ycbcr_bt_709","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&samp_args,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) goto LAB_00274d4d;
        break;
      case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
        local_1128._0_8_ = local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"spvYCbCrModelConversion::ycbcr_bt_601","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&samp_args,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) goto LAB_00274d4d;
        break;
      case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
        local_1128._0_8_ = local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"spvYCbCrModelConversion::ycbcr_bt_2020","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&samp_args,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) goto LAB_00274d4d;
        break;
      default:
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1128._0_8_ = local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"Invalid Y\'CbCr model conversion.","");
        ::std::runtime_error::runtime_error(prVar15,(string *)local_1128);
        *(undefined ***)prVar15 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (pMVar11->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
        local_1128._0_8_ = local_1128 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"spvYCbCrRange::itu_narrow","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&samp_args,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128)
        ;
        if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      join<char_const(&)[18],unsigned_int_const&,char_const(&)[2]>
                ((string *)local_1128,(spirv_cross *)"spvComponentBits(",
                 (char (*) [18])&pMVar11->bpc,(uint *)0x2e3e76,(char (*) [2])in_R8);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&samp_args,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      local_110 = local_f8;
      local_1128._0_8_ = (long *)0x0;
      local_1128._8_8_ = 0;
      local_1128._16_8_ = 0;
      sStack_108 = 0;
      local_100 = 8;
      StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
      if (samp_args.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size != 0) {
        pbVar20 = samp_args.
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .ptr + samp_args.
                         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .buffer_size;
        pbVar19 = samp_args.
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .ptr;
        do {
          StringStream<4096UL,_4096UL>::append
                    ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar19->_M_dataplus)._M_p,
                     pbVar19->_M_string_length);
          if (pbVar19 !=
              samp_args.
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr + (samp_args.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .buffer_size - 1)) {
            StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
          }
          pbVar19 = pbVar19 + 1;
        } while (pbVar19 != pbVar20);
      }
      StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_1288,local_1128);
      StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
      join<char_const(&)[19],std::__cxx11::string,char_const(&)[2]>
                (&local_12c0,(spirv_cross *)", spvYCbCrSampler(",(char (*) [19])&local_1288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e3e76,
                 (char (*) [2])in_R8);
      type = local_1290;
      this = local_12c8;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,
                 CONCAT44(local_12c0._M_dataplus._M_p._4_4_,(uint)local_12c0._M_dataplus._M_p));
      pMVar11 = local_1298;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_12c0._M_dataplus._M_p._4_4_,(uint)local_12c0._M_dataplus._M_p) !=
          &local_12c0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_12c0._M_dataplus._M_p._4_4_,(uint)local_12c0._M_dataplus._M_p
                                ));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1288._M_dataplus._M_p != &local_1288.field_2) {
        operator_delete(local_1288._M_dataplus._M_p);
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector(&samp_args);
    }
  }
  local_12ce = local_12ce | pMVar11 == (MSLConstexprSampler *)0x0;
  if ((local_12ce == 0) && (pMVar11->ycbcr_conversion_enable == true)) {
    create_swizzle_abi_cxx11_((string *)&samp_args,pMVar11->swizzle[3]);
    create_swizzle_abi_cxx11_(&local_12c0,pMVar11->swizzle[2]);
    create_swizzle_abi_cxx11_(&local_1288,pMVar11->swizzle[1]);
    create_swizzle_abi_cxx11_(&local_1148,pMVar11->swizzle[0]);
    join<char_const(&)[9],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[16],std::__cxx11::string,char_const(&)[2]>
              ((string *)local_1128,(spirv_cross *)", (uint(",(char (*) [9])&samp_args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ") << 24) | (uint(",(char (*) [18])&local_12c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ") << 16) | (uint(",(char (*) [18])&local_1288,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ") << 8) | uint(",(char (*) [16])&local_1148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e3e76,
               (char (*) [2])in_stack_ffffffffffffed18);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
      operator_delete(local_1148._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1288._M_dataplus._M_p != &local_1288.field_2) {
      operator_delete(local_1288._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_12c0._M_dataplus._M_p._4_4_,(uint)local_12c0._M_dataplus._M_p) !=
        &local_12c0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_12c0._M_dataplus._M_p._4_4_,(uint)local_12c0._M_dataplus._M_p))
      ;
    }
    if (samp_args.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &samp_args.buffer_capacity) {
LAB_00275156:
      operator_delete(samp_args.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr);
    }
  }
  else if (((this->msl_options).swizzle_texture_samples == true) &&
          ((this->has_sampled_images == true &&
           (bVar5 = Compiler::is_sampled_image_type((Compiler *)this,type), bVar5)))) {
    uVar18 = var_id;
    if (var_id == 0) {
      uVar18 = id_local;
    }
    to_swizzle_expression_abi_cxx11_((string *)&samp_args,this,uVar18);
    puVar14 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&samp_args,0,(char *)0x0,0x2f4768);
    psVar16 = puVar14 + 2;
    if ((size_type *)*puVar14 == psVar16) {
      local_1128._16_8_ = *psVar16;
      local_1128._24_8_ = puVar14[3];
      local_1128._0_8_ = local_1128 + 0x10;
    }
    else {
      local_1128._16_8_ = *psVar16;
      local_1128._0_8_ = (size_type *)*puVar14;
    }
    local_1128._8_8_ = puVar14[1];
    *puVar14 = psVar16;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    if (samp_args.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &samp_args.buffer_capacity) goto LAB_00275156;
  }
  sVar13 = ::std::
           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::count(&(this->buffers_requiring_array_length)._M_h,&var_id);
  if (sVar13 != 0) {
    uVar18 = var_id;
    if (var_id == 0) {
      uVar18 = id_local;
    }
    to_buffer_size_expression_abi_cxx11_((string *)&samp_args,this,uVar18);
    puVar14 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&samp_args,0,(char *)0x0,0x2f4768);
    psVar16 = puVar14 + 2;
    if ((size_type *)*puVar14 == psVar16) {
      local_1128._16_8_ = *psVar16;
      local_1128._24_8_ = puVar14[3];
      local_1128._0_8_ = local_1128 + 0x10;
    }
    else {
      local_1128._16_8_ = *psVar16;
      local_1128._0_8_ = (size_type *)*puVar14;
    }
    local_1128._8_8_ = puVar14[1];
    *puVar14 = psVar16;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1128._0_8_);
    if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
      operator_delete((void *)local_1128._0_8_);
    }
    if (samp_args.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &samp_args.buffer_capacity) {
      operator_delete(samp_args.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr);
    }
  }
  if (local_12cd != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
LAB_00275256:
  pSVar10 = Compiler::maybe_get_backing_variable((Compiler *)this,var_id);
  if (pSVar10 != (SPIRVariable *)0x0) {
    local_1128._0_4_ = (pSVar10->super_IVariant).self.id;
    sVar13 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::count(&(this->atomic_image_vars)._M_h,(key_type *)local_1128);
    if (sVar13 != 0) {
      CompilerGLSL::to_expression_abi_cxx11_(&local_12c0,&this->super_CompilerGLSL,var_id,true);
      plVar12 = (long *)::std::__cxx11::string::replace((ulong)&local_12c0,0,(char *)0x0,0x2f4768);
      pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar12 + 2);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12 == pbVar19)
      {
        samp_args.buffer_capacity = (size_t)(pbVar19->_M_dataplus)._M_p;
        samp_args.stack_storage.aligned_char._0_8_ = plVar12[3];
        samp_args.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &samp_args.buffer_capacity;
      }
      else {
        samp_args.buffer_capacity = (size_t)(pbVar19->_M_dataplus)._M_p;
        samp_args.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12;
      }
      samp_args.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size = plVar12[1];
      *plVar12 = (long)pbVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)::std::__cxx11::string::append((char *)&samp_args);
      psVar16 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar16) {
        local_1128._16_8_ = *psVar16;
        local_1128._24_8_ = plVar12[3];
        local_1128._0_8_ = local_1128 + 0x10;
      }
      else {
        local_1128._16_8_ = *psVar16;
        local_1128._0_8_ = (size_type *)*plVar12;
      }
      local_1128._8_8_ = plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1128._0_8_);
      if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
        operator_delete((void *)local_1128._0_8_);
      }
      if (samp_args.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &samp_args.buffer_capacity) {
        operator_delete(samp_args.
                        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .ptr);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_12c0._M_dataplus._M_p._4_4_,(uint)local_12c0._M_dataplus._M_p) !=
          &local_12c0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_12c0._M_dataplus._M_p._4_4_,(uint)local_12c0._M_dataplus._M_p
                                ));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_func_call_arg(const SPIRFunction::Parameter &arg, uint32_t id)
{
	string arg_str;

	auto &type = expression_type(id);
	bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	// If the argument *itself* is a "dynamic" combined-image sampler, then we can just pass that around.
	bool arg_is_dynamic_img_sampler = has_extended_decoration(id, SPIRVCrossDecorationDynamicImageSampler);
	if (is_dynamic_img_sampler && !arg_is_dynamic_img_sampler)
		arg_str = join("spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">(");

	auto *c = maybe_get<SPIRConstant>(id);
	if (msl_options.force_native_arrays && c && !get<SPIRType>(c->constant_type).array.empty())
	{
		// If we are passing a constant array directly to a function for some reason,
		// the callee will expect an argument in thread const address space
		// (since we can only bind to arrays with references in MSL).
		// To resolve this, we must emit a copy in this address space.
		// This kind of code gen should be rare enough that performance is not a real concern.
		// Inline the SPIR-V to avoid this kind of suboptimal codegen.
		//
		// We risk calling this inside a continue block (invalid code),
		// so just create a thread local copy in the current function.
		arg_str = join("_", id, "_array_copy");
		auto &constants = current_function->constant_arrays_needed_on_stack;
		auto itr = find(begin(constants), end(constants), ID(id));
		if (itr == end(constants))
		{
			force_recompile();
			constants.push_back(id);
		}
	}
	else
		arg_str += CompilerGLSL::to_func_call_arg(arg, id);

	// Need to check the base variable in case we need to apply a qualified alias.
	uint32_t var_id = 0;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
		var_id = var->basevariable;

	if (!arg_is_dynamic_img_sampler)
	{
		auto *constexpr_sampler = find_constexpr_sampler(var_id ? var_id : id);
		if (type.basetype == SPIRType::SampledImage)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				planes = constexpr_sampler->planes;
				// If this parameter isn't aliasing a global, then we need to use
				// the special "dynamic image-sampler" class to pass it--and we need
				// to use it for *every* non-alias parameter, in case a combined
				// image-sampler with a Y'CbCr conversion is passed. Hopefully, this
				// pathological case is so rare that it should never be hit in practice.
				if (!arg.alias_global_variable)
					add_spv_func_and_recompile(SPVFuncImplDynamicImageSampler);
			}
			for (uint32_t i = 1; i < planes; i++)
				arg_str += join(", ", CompilerGLSL::to_func_call_arg(arg, id), plane_name_suffix, i);
			// Manufacture automatic sampler arg if the arg is a SampledImage texture.
			if (type.image.dim != DimBuffer)
				arg_str += ", " + to_sampler_expression(var_id ? var_id : id);

			// Add sampler Y'CbCr conversion info if we have it
			if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				SmallVector<string> samp_args;

				switch (constexpr_sampler->resolution)
				{
				case MSL_FORMAT_RESOLUTION_444:
					// Default
					break;
				case MSL_FORMAT_RESOLUTION_422:
					samp_args.push_back("spvFormatResolution::_422");
					break;
				case MSL_FORMAT_RESOLUTION_420:
					samp_args.push_back("spvFormatResolution::_420");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid format resolution.");
				}

				if (constexpr_sampler->chroma_filter != MSL_SAMPLER_FILTER_NEAREST)
					samp_args.push_back("spvChromaFilter::linear");

				if (constexpr_sampler->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvXChromaLocation::midpoint");
				if (constexpr_sampler->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvYChromaLocation::midpoint");
				switch (constexpr_sampler->ycbcr_model)
				{
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
					// Default
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_identity");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_709");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_601");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_2020");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
				}
				if (constexpr_sampler->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL)
					samp_args.push_back("spvYCbCrRange::itu_narrow");
				samp_args.push_back(join("spvComponentBits(", constexpr_sampler->bpc, ")"));
				arg_str += join(", spvYCbCrSampler(", merge(samp_args), ")");
			}
		}

		if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			arg_str += join(", (uint(", create_swizzle(constexpr_sampler->swizzle[3]), ") << 24) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[2]), ") << 16) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[1]), ") << 8) | uint(",
			                create_swizzle(constexpr_sampler->swizzle[0]), ")");
		else if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(type))
			arg_str += ", " + to_swizzle_expression(var_id ? var_id : id);

		if (buffers_requiring_array_length.count(var_id))
			arg_str += ", " + to_buffer_size_expression(var_id ? var_id : id);

		if (is_dynamic_img_sampler)
			arg_str += ")";
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(var_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		arg_str += ", " + to_expression(var_id) + "_atomic";
	}

	return arg_str;
}